

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

QStringList * __thiscall
QStyleSheetStyleSelector::nodeNames
          (QStringList *__return_storage_ptr__,QStyleSheetStyleSelector *this,NodePtr node)

{
  char cVar1;
  int iVar2;
  long *plVar3;
  char *pcVar4;
  QString *args;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  char *local_68;
  QByteArrayView local_60;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = (**(code **)(*(long *)this + 0x38))(this,node.ptr);
  if (cVar1 == '\0') {
    plVar3 = (long *)(*(code *)**node.ptr)(node.ptr);
    pcVar4 = (char *)QMetaObject::className();
    iVar2 = qstrcmp(pcVar4,"QTipLabel");
    if (iVar2 == 0) {
      local_50.d = (Data *)0x8;
      local_50.ptr = L"QToolTip";
      QList<QString>::QList<QLatin1String,void>(__return_storage_ptr__,(QLatin1String *)&local_50);
    }
    else {
      (__return_storage_ptr__->d).size = 0;
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (QString *)0x0;
      do {
        local_68 = (char *)QMetaObject::className();
        QByteArrayView::QByteArrayView<const_char_*,_true>(&local_60,&local_68);
        QVar5.m_data = (storage_type *)local_60.m_size;
        QVar5.m_size = (qsizetype)&local_50;
        QString::fromLatin1(QVar5);
        args = (QString *)QString::replace((QChar)(char16_t)&local_50,(QChar)0x3a,0x2d);
        QList<QString>::emplaceBack<QString_const&>(__return_storage_ptr__,args);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
        plVar3 = (long *)*plVar3;
      } while (plVar3 != (long *)0x0);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00356b94;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_00356b94:
      __stack_chk_fail();
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QString *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList nodeNames(NodePtr node) const override
    {
        if (isNullNode(node))
            return QStringList();
        const QMetaObject *metaObject = OBJECT_PTR(node)->metaObject();
#if QT_CONFIG(tooltip)
        if (qstrcmp(metaObject->className(), "QTipLabel") == 0)
            return QStringList("QToolTip"_L1);
#endif
        QStringList result;
        do {
            result += QString::fromLatin1(metaObject->className()).replace(u':', u'-');
            metaObject = metaObject->superClass();
        } while (metaObject != nullptr);
        return result;
    }